

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<bool>::captureExpression<(Catch::Internal::Operator)0,bool>
          (ExpressionLhs<bool> *this,bool *rhs)

{
  bool bVar1;
  OfType OVar2;
  bool in_DL;
  bool value;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  bVar1 = this->m_lhs;
  OVar2 = ExpressionFailed;
  if (bVar1 == *rhs) {
    OVar2 = Ok;
  }
  (this->m_result).m_data.resultType = OVar2;
  toString_abi_cxx11_(&local_38,(Catch *)(ulong)bVar1,in_DL);
  std::__cxx11::string::_M_assign((string *)&(this->m_result).m_exprComponents.lhs);
  toString_abi_cxx11_(&local_58,(Catch *)(ulong)*rhs,value);
  std::__cxx11::string::_M_assign((string *)&(this->m_result).m_exprComponents.rhs);
  std::__cxx11::string::string(local_78,"==",&local_79);
  std::__cxx11::string::_M_assign((string *)&(this->m_result).m_exprComponents.op);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return &this->m_result;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }